

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_ledger.cpp
# Opt level: O0

void __thiscall
cfdcapi_ledger_CfdSerializeHashTxForLedgerIssuance_Test::
~cfdcapi_ledger_CfdSerializeHashTxForLedgerIssuance_Test
          (cfdcapi_ledger_CfdSerializeHashTxForLedgerIssuance_Test *this)

{
  void *in_RDI;
  
  ~cfdcapi_ledger_CfdSerializeHashTxForLedgerIssuance_Test
            ((cfdcapi_ledger_CfdSerializeHashTxForLedgerIssuance_Test *)0x37e4b8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(cfdcapi_ledger, CfdSerializeHashTxForLedgerIssuance) {
  static const char* const kTxData1 = "020000000102cb3cf537fc8f7bad7a008d7bd2ff1b366473b9e338d5403a78294c97b04cce310000008000ffffffff00000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000094593c4b886334bc7ecea030d040d7b2fd25500d413e8a7ca5b71297298089f1e0870979c640c38fbe466ae922a7e8847c60463bb5145d90213aab662549f1009eacb3cf537fc8f7bad7a008d7bd2ff1b366473b9e338d5403a78294c97b04cce310100000017160014f2145d709c5e221ea15ac480366814c2585055deffffffff050af7c1b8463fd7b9a7ef3e488b9817d468e4dffe321d1304c14eccb8ebe15d4def09d2bddedfff6cff0425e1b2689c0e2b91f42175b2bef6051fa9daf008bc6bb8a203cb3d60b2b9c2f927247d5aef810d0214215411b54051354a75413d2767ea622817a91492617485a7b6816675a8f9d450a36f442692dd77870a017dde03f618d0e986ed355a31cf82938cf559bb85b01e1f53eb57546c608a9b088f4bc9c682429d64ebc6e2ea272870e7d643dc72c95c4dff1e7806109fa7222c03e165236ba1571c4e568784a243190a68d6ba120e219de67391727deea3052ad417a914e5f656cd3ce7597eab209b4c9314e974eec2a86b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000000000c35000000a62316bf709934b96189f26d73a6db70beaa4d59cde697bc371dc23624e236476091cf19548aa700e13157e0bbbbea68db938c3820ec6d97aa63c33a27011ca34850274d68771e05a2fc59583f7e5446e81c820f991906884d7f66e47082d94a4e9b61600143a67e14383b6ba30eb55ebc2a3caa28cfe84a2370ab9d6e3adc44c8d6dab70f074bbb90a49976d1f607380b09992729bf11d1d7139094ee3ab1b967ca2fa042b56ee625d23efb88585fcbbb56c9bbf71f28020e8254502749a8d09f2ffebcce333b0677d8560644bc0ac6e0e090679143c4b97e593be00160014520d59d1deff1152fae4379383b52f8d8452c35f00000000fd461040339fcbd000ea304bf4b875c9442050057c90246b1ee1bd8f043c5931070f17905311ba7b517b515cf3fe2f2359574bdf6ecf0657b6fb4c3437d68254c6a6fb1541dc2b15f1eaff7d9cb402d6cf74f12363760b934460b6106b9ad89bfa303ff73678f3b7c3f34e3870a0dc3113cbc470ed54f0cbb6e5485dc454e90769585ac6544880a87f53fc3c9b9f9bd3dee4bfb3083f435c55cf64888f9e855773c34513ff1fcf560824a8df312300e2d479ce44fcd5e6dcb37ff1a8026ad51e6c4b8918ec4c701d3c1308569704c973bd692aff7bbd4e95c7466819350d343b6ac9e0683e2206d44f8101f96e04372710bc87a141cf33c83b2b6ce877b2a8660a424844e74ffc46644e3a7988d03d2e816e03d90396b6fecdbfc1e4ca6a8a0f38377a5a78ea111dfe40db47233afb1542222bc32b68bf8710f87736a0a6390ee077e4d120e1766902c5d34d6bd629bb6bdccc8f2673480953ea5def739f020de63412f08d3b747d75778fcf5b6ed38bcc8af500776f0624e59a01eda3c0fc6f059d288fe2777b0500138dad90acd14e8a76319ac9e6c5f6a9a57e7f079ab8fbc912b1a451b5bf6d4d8082a104c00d2afdd490f63f422de8bef77ecae0296f93c5bf9271800bc9f77719a3d524c5a60c3e11e1e6423530bb6624e5df343b60de670809f00cf4e035b287492c5c2ae4961abc97f396ca0cf570ccce781eac2b70caaca60ae2379cc5dd0fae2bfa8590bb94a749974e11496977e2d3a14d45f33a7aae0c7d2bf9d3966ab25293c40975f33b83881f4022523d0dc4a4266a9e3ceed36fd446866136b1e1e8e430baeffd77984b287737cae0657720ef6aec310f28b846e4fcc9775e2daad4761e6912ba6e0c20007f1f6e6dd94f8858fb9bd91f09cf5ef839e095d92be6aa874c6ca1dc8afc1cf7ec473354667486fe01f560d16c1bba7b86134f03b45eaca69c237493a2a68c07ebd472af3ca6ae8b956af9f0e0cea2be96522364859412c31f4d0913f53fc2a39e0a46abbe4265f464584166a5caec9d0284e457aef2bcafb9870f2fb6009f1d51b42e3c07d8fd1e75e1fdc052be0ce1d8157f46d4bf7f005cad1eff6298a284676410c2256b571261223e4ab1f8392dd67ab3e6062573e276f4d94981f9d9c23d06d9dff3dad34e8317d72da6d390a28511eef2adf84bf060b8ae092905feee86e7016e4917878b29c9bca96da5d4ea8051b2ab9145e2287ac22436c49ee5759a4831bfb8ea94d06a2355dabe2ae1b3410dee88800d0c1bdb64a8db16cf66e3f7ca2a255e89d19d4cf4f1e274d0883d85bebb6e268d9942d20ad12e4fc191a3d0c1d40f5327cbdc97f9f46b7b587fc524275fcbabe77070d82921de31addb66039a13810ec55007142f23e9fb0a6f3b97cea6ef66386de88e1601ef99295f8aeec2436524f340f32449ef6e23ba5ccbe5cc5710d41e07dc038877dabe99bb78ececddc42054082d1870d0e0657c4a6a7f04b60c916e75e6088cf1f2a62a2bc627668b0dadc57e0a34182481e86357f9edcd363012d3fae7beb3982a947d670c264984f484edc13c4269c88df19c7ca855b7c805db471f82ae46bb54eeafc11b10cba8f6d3668221ea2c094274bd4f659ecae387e51e262ab70cfc5c10bc08f299f0911b0841247d4aa334bda278d463b87dfcad5235519f1cdfc5553548cce23309f4e570c4646e735f4b9c52b659a31bd7960783f0373e6b6408c05435142329911dba7f3904d96d72f474c02965fb8051a0abffa169264c744688ba28d97658a3bd1b89f002f37200ee69465d998cc05bff39dde187ab2681547161fb94f17b8c62724c73033ca465df4a6213de1acde4edef5771ede23c59568d3af7590c4de58a2678a5e9f8427ee60417827d20a9d51b366b62d0a438572316e15d37ec66cb595d003b7facbb6f79a57cc5593b2ce6ff9e02ce1220cd549be191209cb05170e4dff1e6b85321df6cc73fe65cbc155710008e1b8240ad02c96b18fd437ec6d6517a8281583b99d7e1fe97158c4916cbed29a9ea20dfd78693a1fbbf6566d9e3428b90fca88459ac86c9585ef2d77268e7c8b05de99d0cf228d8e94f7de12d768b8e715524e9582876d57087c3c4681cae0cb532f6832790faaceebeaae1cf220ac65c7b5ddce5a68f20b348227308add3730eb33e0f4009b1b58e48a7904631ea271aafc5762d6d424d0a30cef400780a850c538becdd1cc396774783cd68fa2e97a72ad01a8351a2a5bd59dad9981bdfda314d864b0b88e73c1041df09207ba3c09ce5c690906e0b9d725bc585041f04d748730a15d86f7457774b2a6bc23e3141e244e58d6c799d98982778955e8ec6fd4f6c43088a7fbfe7347fa32d8138aed392c946fb6d03d31662c8455ac63f21bac04ac9a4a34aec5229d65ae978bd42ebb1016bdf68175180ea70b2bb40d4e999271fd18aae2c11070b30df73223ed4aa3225093368d0377b78e2a117781286da5b32f9c0cc696c88f183c110a80bb2d9e16dd684aecf5a8c2afa852be927acd68f9c2352b07f3a5307421e2f42beab97695aac98592b4c2a0792bd933ece15ef2b97bbbc1fdfff0bf65d419c1163ebf1e45cd84034eaca7c4e866f34f3b7d88a1cf11790ec2ee602badf6e6646ca7a488960cdb12042b21b53489bea83aa32d83c4e597308cea110dffa00a4f706b669b8638f0b6667b02b3976673d576c87d2d9bf0a616686626bea49f2db5a3786088a23e82c44ce07978e5e0f3338b6f1f6ad60a298375cd830d87e8d95c017466ef7faa96006008423d416d7f5e39d921204cc524c7644b423db4ebd41f5a8fb305cac65499855897c031e812516adeae9b1fcbbbdd70a326cf9f85a6eefc2fe4ba7afd47fe3394c575150a93f9702cf01bfafdc61569e681bd8dec48d7533d63e5c59aec73357d28632c4360cb91cee436f0d32000b3d6fba31e0eee04ad2f214586514eac032b26b691c36b36c2e994de8110e42f6b5e0da252e60a1eda0149139db547041ce7d8d54cc76e77ca06f442b77fe37cd1f67ecc3304984c88897c54902c059139bb323f6a0978723976fc6939e5de31d22140691b2870fec1408c45537248858127220fec3636980968ead3952b89fbbeb668cfa94489137a67ca49f4eaceb025f9724d5c6b10291e0d2625c37186d6091e6128ab0b18b7783b08848ae8fc2d3880afa37bc051672adda6cf01b370b4397dc6f9ab910744d82b31fe10cfed087f2bdd531f028445c08df851d27548e74293ce1861866960ed51e851f05ebb8d4230315c5a540d0ce7e08087f3eed06c5387a3167669bd32fbd10a21ce092f24f7e9f35977003a31087caeb97d8c0043bf83c5a39b1a7983dbfcd4cc6d0bba07c8eeaf862c6413b5ee93e75cf6f06113a9ac5d2f5d9e832097a6c0895ba4d2ae0445f3c318cbdbd8cb2e51e40f39de62c8734881ad369c32317f9734a06823bf738c199a87e2d3731be98bd795644f7ecb056fe9f9bfcbfbe6c2007da6e1e6860fbac03eec37735c3e4b2341fc65889ee5f9ae12cf4ea6a693601ac69fd778ab2b88e004ec59ceaef94ada093e50864b5396417cc77c070e4a20050ad54ca01768021dbbe1cf31761e9dd8e906da04e52c93bc3a0707a476b7f9a41c1e89856e05a02821931b87cfe01be485bde7ccc4a5ba9602c31d9b3f0063d8535bfb78f9ef8dfd6329b707ee96bb46ddf2bd2477358cd21f3950b19ed6ba4ad0d244ec4885de840d4d465653e001af941e66e2c6ff3aaad7fec45248788c040f5dc33cca7a4d6daaea10336b8ea1df016a1c01239542777c9b8e382b10286d380af70f03760855233aa5e05ecb51bf8e35de7ec28afb9015bf0d55e308d7422f0b8b9ed0bfd4f633f5461292fec6979708d16e00cdb47f88394c7def406d7b93523a746629e6177d35c240692789346f49ba87b13fc2500adf7155f3540f5a996b2195c198116fb437c64c83fe4a6c1c7a304fe66edb51a6b055b0b2914a82d8a27053b02e16c3529ce0a0ab07676e998f5066cec80f028a0334c0d668ed9fa59da6bdb5fe968d59cb29c5cc82ff8621eeae8a78f9aa421cc7330802aa6f15b12bb06041a58facb2e75c01445a191ff2d39ef26ea77a11d8f51ee9aa5141664d5ddd777ea00da83330cd140c5ad440f8a860cbedef0640074610b4af156d2b773c179013ea757f7137925a0a78c9c39b603d156ad675e2d0df697fc569e3af82a19100e7b4794f1d490f5f20147a4ed7b73d4146325f1cf524098be0b7aa4aff3805995559e518d393196159292963da581a7abb323d1683757346355a601a981fafd98c6a5273bfa45805ccb41c97005f56fc465dfda3786d7667eafd6a0a6ddbb0990736299817f8c09259054f652a1fb75932187ced1a2f130f74ede69d72c0f5ec67bcc82588d9396ac11990fb2b52dd934ec6640bb75da343f384da9c2dcc5dbf3abe5a15a9ccda27176d4b84b078d66078fa06e16cf557d8f03d80e240c90634d3d788c1f0f77218e9f7be217b283348bb191ee6452657ad867b69776a152e9b8eb340231e293c8cef659bf4c7d0097b1e636ac6549a120c3fae90e1c06da113023529ffdbc166b0d633d3898d816d5065e10b7a11d94c00b585187d14174e661b4993cccfe648fc2890d33d2e80f00cfdcb6364dec558ac9defbf149461c92510e92a338001f1f7db1cc838097710c3d418bc949453a13001d7ea004c90d973fe209ba6dc3c9b70e34889d3d9dff4a427410e734674985e1dcc0af440d70a20c3c3bf5fbe0c79ef0c861f5b044f2777dcf23fff1d1d1c6e97d77d3201a964a627e80d319cc81ed44ac2f62e84a5f5a501d2bd23cb21d4cbcad6095cbcda25a91be37867a812be975e1ecd00567345bf9b982d5943895380ad095eb19bc902df049f0bae178817f787dbdd3ce635581e34930fa018ed03c3f2665f7d93d35eb0d90f2e183bb58df6b6be0a782f3206ac950cdd7bc47cb9e87266ceedc885279533d004fcd5341fdbf9e8a68af5ff6f8e7aac3568809c19ad6fc2a2cf637e71ac17b8bfdb94ea20fe83630af631e91dd62ee6ca26bdb249eed90cbbd10f6bd98f9f62ce244e056fa369511f64950dfacaeed00582487d0b1cff052880f07196d9e69e861c365cdc725c75f7c81e6099ca04f2c71e07745a9ec0375028a97b8c5256c1139cbf7611659536d46bf7fbfac010285c90586a816478104d435271e247cb607e8a0eb92da76061d5c9420c3696f592170ac3ece244d2259ac84023101ddc157d507b46d9b1d4c3a58ffe5317c1e9c6bae87597b7f1b7e61dc7d382e198f0bb906922716930b7a601ec4ca77dd1953a9d09b33818a2e3e3c6cb8131be884644ce8520b19552af6721cdfa1bfa5dc6e3cbfb46714b133ef68c3a59e38e59450dec6bce31c0782526dc0e9f494db9a594e8ede2a327154b3054a66e86ef3ed7574cadc060ef8a229ab8fc52fa13b50f18867f58803c017bfe412ab6f5051b8f5deab5b9e9937c1eddf5be1a103ac58c5682670914d7ced5ef2eec42a04ad13758faa4e54b3dacc5b9b4fbfcede3b7f573e7cff74e61f10df34a1d3fdfc88ebbb75f8d0ef86950265e6659fa291c44d2e768f1ee5e5eb89cef6f8e564a0fcd65ec9bba5fe47b9fb54fc897a69e98205a008e0283ffa2fd899224c19f37602717db5038f181314f46df89eb186bab8b7c1cdf6397ccc9f8f7a38ae013beed0988745fdb121531b8effe077aac5c48cf8881c1d7d18b7735066f4dea6c5ce18402b35df53c430c472d9fa9b5351b9a9172729139fabe8ccba09a32632942bfe13dd6208119b048533c68b5d70b42485c235274635be4268fb1fc15f2572550025b086e33cc539fb9d4c8324a44721fd46104033a0344e00b2abe4b4485a41328832880778659b2d92dd6a78d2674f1d480bc159097901f98044305732e7f1b12653c0f8214b7cae9e8e6fe1b0204c0aa053359acd2963d487c3d4f28f151146ba566fbfc2e92f97a27bd019443547649b04d9f12733f33743865500530a727d3a4ae3d6a258b98ad761d1545d557cdf201ad01eba9cf111cb7e8e8ec9800dfee90b35b2f39c93fbdf9dd7e3448305d2240b76a6c15aa3f2aef963624c8207a56d7831881a5c464a02a267d9a95bb0da564718e05ecb39ef0434cdf5536398ae769c82a4b257be9ee41c9ee180533ee5126b46843fa6ffb1c42d4fda367a396df7fefe053200d72cbdc4f8d31190d402ff5023bbb9221b393a5657c3035af5d41d150dec8e21d0f674408014a7a2df5eaf4e5fa6d27b5d2e0f90c4d5271e95c7e0470ec6e4cd2202f5d6d2304537e78ed31c5a490a1876f18fbdc3b41265988db4e9c1ff2b6334de46d4f4c749b08792a31867ada1e13147ce70aef829b276e98c016114ab369e7294003a9b2f0d56f2d6bab052d3e0732e8298e72ab3b9bfc82877fbe60b1d1e7e97acb28068a9a680a582682f67f5f1e5022bdc46af901f449aeb0e242894687662d34089d09117cf0e72da318a7e19a5d5f6afafd3bc5f08f95f5adb0ab9a9454b2dcd8eddbcba6fa35296f6c45b61f80524c9ff0cd699ab518a56aa225447c6201c7a2ccc1fb7de661461a3cad09b241e51e22b5ed8d1b361b0866f63cae737c01cb2c20b02618fc5b02b96ea687acbe75bb9f2148c69746d688af05607f4b6950da4332ae26ed24e33e031c769c58b29487719bee3947c8785f2d21dbaa4745cfbd2fe6d17fa813a5988d2f312862976b7440c873d4b21afb87485e1a39c9ab5b25f3d72830450df633de2158d44089f25a8ee42f31a37c79d63ceb460aeab8dba7f30d0cf3e2e00c61347d7e0f2f9ef98e26368ea85d3fbd4cac5c7288664d1e0675fefd4422ded37bb4bd44c39579c52e597e798a405bfb1a2010b6b4d30f0cf00e35b695397da299fb313cc6d1b8a4147652c305c99cf4b5ba671d18a93af3e4941442107ed3ceffb7188a1bc0f96531d6397d5e298d9e7be1c2e37c798e03caa65312c61c792c269cbbd84cfcc61c4d8e8e2ab231c8619f9c5abe7e7df2c68ca13f3d7bf8df8a86499ef05cbb6b341d13dbdbcc0d16fed0da43403d11695458ed5f04c3bb2022d38e9d7a560c63deb6e5181a855090b458420e12d0015f09edb34b8190d7065c9b6725bf2a445847a44556b1cc65fe081afbe973d5cfb772c487a734d129a73c7271c616558531abd8cc224d7efa3e831e4cd41fd396b947bd9fcbafcd475c8ede0301559ab8d1239d98f6af13c901daa5ae2970f47d8d75af889fad2bf808cbecebc92758ca479d5896adb3e29da9337cd7d4256f78b92f5c1a63d18d1b1bbda324e4e04af1c1384eae0a8c8ac4ba1690235d5873faca0f5315d02aee1ec7bb631d113c748c2870a7f90be9e78065508586d051e1f200bf1a54ae64a4d3511aa88f91f47893da884ff10c71b5ad608622f4b004080c2894a402ac8f3afee5c32c20bb72a8f2f6f1031317a78b3fc4e4233f3bc725172183be5243f20082e68856351389c35baa9b479bceed493868da178dbb2eec36e2ad7f217eee9981e82b668e33670e17844e340ecf9b78b6568956891486fa23ab642f5fcff78791d29788fcb942f103eeb40ea5169c3f6efe9a232ecbd78634140ae32b9959afb43c53283bff12357e04d7854d543c6092283f164ab9302060bad467d04606fc2e83fd159a098612b7da0548af655fd97f023b05c270a642eae1a9550c91af04c16c96e187ad578e00a957a1ecd3b6aa41c1f0c2b100922a4ca152b16204587839b53bc61c0a45ade0d94393eed14bcd73cc2edf386addd023b95fe7753d8b11e257123238532cf192354d2e08590b69e46419468e5379ceb1340a17961dcdd0f97eb1c081b486da263c285a3729c229dd9c1d7a99fa101056cf18a13a36f9853400342075efff0232eca033e8571c22c8f2db5a99de8f71df6301794b436bfe247bd4c7ff4c517fed336c516758b9efe6fe3eafd0d5168d3cf02202a90d55cb0d82fbd145a3b2337216f0deee05520f3a3ef86a5ea452143789f27d9620d9e1651156ec4b2780cab3d02204020e61b30b8381f521580f17379a0cab837e83748496898187cb78248a081117278e0c5509584bc5d4999a375a2918dd6a3f578b47b71e6cbdc0e73e6323b3dcae7ac1f629c459b5af8cd4ad909fc4e0116f8cecfc7770c391e9523c418a58afca3b1ab760e455e4f54dd9fbbfc79c65abb2732258d32f56b9def02cdd90b60e881d1aa56a1836e7873bdeaa8e80164261da0140cf51ed5298cdc7ff1a0e1a881240259384be0747ba17d4ac2c97e2d6fb6bc2c78ab9ba660b48294c3dea7e71a9ef4fc9c45af1b15e8140f15fdfee7f87d78c327e510bd56334cdf05e64df804df244d2d3937899b0e16ba142acda9c1505e770bba404d36f14dece145639cb75bbbc1a86e4f0dc80761518fd3e4578ac7e8eea2e8f14649c314ffcb41b68e313beab92f6071aa478a5adb08be689d59afb3e8509ad46d20e1d4fc4f7ccabcbe5f81009194666f8d1d63eeb5b2f18f510c9332deb573438164d25d530fb71c049d5a04d29a43de8be95732f41429aa1fdfb0cd46264fdeb105cfbc6ab89a29ccf43f29807b790e924dfb8bf35cd7374343d49e5359a6954ae194efb0aa40574231b3fabb3473bc086328e052b05256688cf2694c74605c8318425168ce75fdb765480c68cca67225d352b84183ee219773eb4ff599d01af0315ae4377202f528b6080f057896872e389fdfc88eb92067f9499975b5d91d00ea2e5ee20c52183afdb84442d5640d37209e9c5705e70ebc536e290f9da53d621746c12c41e4310cb90c41f64d8df8d050a4820eeb95fcf39778542f3de26c93b6c9e50414797be1a28459ba25097798518e0387ea9f316fc93e12db8947ec6b1bb3ebb62cec8d02833562abf121b4c1f6b927c0adee0ee3ddd6eee9f21db2ea8be594d22db83cecb9f395ff91bac59a16cee4e027b3681aea0e09cead76ce5181e33a46b451760982caf1a06fc6449becfd2851df922386c91a287196ff912bbdf9320adb550240780a418db1eafca240c1be1a092764e5d7271e0cfeb0a43dafe985f40c9e14cd836ac2e5cfe37f07f1e2051c9e0ba5e060294da7c1237f3398eea3cd7ba1c24923885508021d1fbb488eb5bf2c1f7a74ef302b9a802d6fe8326e5fe7401dc9af9aff312f43aa01a33c41386093e1871a5e37907fe304900f6a8c2c35a799031bd6b7a3e81fa730342b309d5b5a8f14ff5cc011e581add2124223ae387ab7c8cf93e690bd8af56f4255c96117989656bd75236b68afb618a7a2d9949aa478ff5778fc2390a70e269adf79fdec96420c19cece171a290482b7cc45983799a32c206ab9401becb383a1663c1f7c5d5ca1a8b86ec964c087b9dfdad483e2c33737e7d9924c3f0f42ee8ae7ec593bcb08d9a5f5289b623f4c212fa5a5b2106d6bfdec6e5cfe5303288371af479e63a544ca4c9049957173c34bbfb1cf421125197aba3f2f06dca28085e68036d7f6a008b0f1253c701a6710526818407baf81";
  static const char* const kTxData2 = "00f2b34fc7540af1ba8e0ff72d705aba6951144e9d09c20127bf41a1d200f0b8f13d92dc543c82b5a000a1b6f9c2b909dac2a952d2b3b243dd35fce5576552ab819b3f7ed3c2cb976648b1a04140d7b670f8cc2da8ac8315d69138adf51cf7f3f74b29a9b58a65c0055b80cf9c821d269465a2c766a291846b7694755c491fea39847b4d65bc6d627bd204f826917391e02e7cc8e48f8d23cd2cd8cbb5c12c7ac1d1900a96486c2cbbc577af21ee87fa1ccb622b71d9c46911b7f2e1140ca225df267ddf14ac496d2c2405675cf605ec15306e69ae0777027b5b64fffe2e758801def451cf100a4c76b645de04515d66cbcbf7e6e64c349db696372f251385c4b23a84bb046a1c515592fb263b0e7e5a85ff210e15887201d213e49309b1e166958941ab167f34ab65dd1400cf7323c2325180b82e91d3bfae91f42538f43d5cce1b4f630343c24b34440934bcd84154a3b891e0419fbe34edce4365b2f25e83d6d1ae0e2c02e021aea34cdef0de01937890d245d34ed47d8528172963d7eb44d32a76fb7c9a733050a5ac7b707e0763102d2d2d0d9a37e7424e4072fbbe527c2b6a0eb3b90a994cb65c540e64aa02f0b1be34a2e3bd7466a5487f98bd3928aab8fa2f9ad4631ed6b23a6f4daa2e1d052f7dc6e9afc013ae6dfe7dd6cf6458fb115596d03ab25a59805b4e97e8d6678d7f6e8fca7f9626757bc1a322b750a359d952f5f5df8c35a306981b1a773cb8e51f499b38b98a98cff0667a10b30b14328529ee582eb220267a45015b5a4981615ece185d9c65dba7bfa7bb3f34dcd2e6f571b4f73e43e44001f4ae23715051424badcf4c90ed9c2abec4b6d79f1ff448a47ca594b44d07d601e61219e6d2956abc57126aaa81f924f06bd5760db18c98a0a089024520c1974fc9f8bf07757f2c8108e543596b3400852450ca411459db48637217052896e220c9dd6a2a6cb4223bdfe0cb6bf88ba136dbbef381a64e4787d53e172313694d33974791724865f60f8a8b1b7b9db5fcbde637ff43e0fa5a977219232f06f7df4b4c9437f9338b63db6b7e8c1c84d57a39c03d3cf6f4d69fe1f69a267be841258dde22fe5b0e2f2585bfc3482dafc10c1bea9961c69e579bd8b3709c13af7c6cdf27f843ac6278a145ba73c6de532fab33d97f6084e7e487bd67e2ec22f467800a04bcd9d380fdddeb93e954e319111691e5472903b0626c5ad2ca1db6e2643a31e38d307df0b11ce22b0eb37133634675d52268788bd4abfd6951b822aede6d2dc09c63efe80a23002f2a3ac38324187e3a3a04b13a317108a35fa5f2ce96aa7b053ec6cb0e0c0e41d89e17f2a3551a3442da8963254e3a448f49419cd37e3f08f82411d40d0c08bfa721ee509300127bd45fdfb7b38c5ac8ffd421df14ab6651a8a42ad5dc6d5e85a00b577242545ad4b4a72e87ff868e1717d9233b67f9e479a922fa3d5fe8d6e057c8f78d6f83e2937d0630ad46f6e83f675a56bae41ff549719cc9cdf6a2c414f6d2c0156274c2af913b0328e12a314501f5ff45ad62d980ed65a77c1df9b92e71d809a673fd668c9eaed96d6180c2bad9a78a52e62fe401e1880d10a07807ab639d2f645870b17e65d9d5838b09790796a6aba2a528aee2875eb3762847ad477e46903daf9a5f8d904d21e69e7fc75564647d5593b5a406cdbfb16d348dfab151cc7b6a77bfa4d4a4b8a585b9fa0a8cef3e3a21975ee4299a903b3f5b33d6b1259965aeaf5a1d1b38ea9af6090bd71ecd105a51f49cf0040266cdaa9b931f18a4d0f51df0bfd21a5476ad48fffc356090d62297e688c58cd355e569f4d67d51b1edae7bea67eabe1e9e7d3797fdfe7c030cadd9cd90ae3b6e942eaa788f56e79715ecabb20cfea4457771cce2b8b837a36179e7cac54c970d2412dc7364ec162877e89280a9bdbda09ea134b116ebc0ab367bd7d13112bd040e37e2772ed66008599fb8f21773f34935cd89240e06b8128e710265d929ceb3f45961a16a5dd1411298cfebaec9fa185758262489495fba578e5c4c93ff607c8a9bb9b3576b8b7f6dd74b2001f3f434c2b6448022e9e044c9b8f40b086e3cad0837126682e20915f2f1a19a9ddddc70682776795533e5b2f3b3967d528c32f2a8e9dc5ef8204d77f6a9367e3b61b8eb92307ed8dc15e110a86e3d4f92f49096bf8e2191a732b9b51d6c92e9eeea7ca7bf9883afe3c90000000002473044022010527e1a4f89c5766ae95d995eafaae8c928d08b752a1355e785c601ff463b2602204e4830fba56cefbc2cf1602acb4775566b16ccb91284c884aa9d657bcbe0655e0121030fa835a11a2cb01c58e2358dbdcc6d85e35cb2a38ca3d3d660aadb4bda2ad7f9008304000d75e33595c8fa6ea9ef8dc1837124cddb0a5031a5fbbc4b9c950c5dac119ad2024262707c5b1e15ade06a77666104c91abfec0a858cf797b856ac0ee1046707d8a24bb86a794d5e7d32509b0bf73f7b5af1d38dcd9af2c577e694bf3b167598608e10ffcb6194da48b33858df81becb1a78fb407af028518175316dd740583c47fd4e10603300000000000000014417220030c55d3b76aa565159590d0ebec3c9f142d60cbdd499b4eb19d03534ef974d5cf841a4f2f907aca3a9c11d7720dd5ac246e3d332a28148eff77f5f9b706a6921ed03543a596ef6b365d615d8d1837c5378e30a67df732d3ec8039d65b7d48994aaa05cef5ac8489af149425d48c3af790c97feff4d04bfeacfcb877ead88e8e0c0c413a0e32c1fd3609dcc906f25d657c402946d32dd9ec54fa654850a04d2f5171f7928a0aa164e4410618753bd4a36f1c305bf8a27d5f5917e1a227e70600f590502ca9c51be28f4a15b46719ed19819ec31adfa5146b6ae4dafbb5f43bbeb2f836e28bc4229941e1a8318ec04da43e77005434f487460a794c00a655f3de09da5e6555cc0030a7ac416481f5c220bbf417816c4434cbd9c7c8b3338acfdda40afe3ee39947ad052807e4c6d089d228243be7b7ada35116db81619fc7105c425791596cc3a97c3df5fcc74701c66dd437fedce5a1940db2649315c0790cc55abd4b4fac06eb55ded109badb77b43a6baf345a8e4418da751522718531e541ec9aab05ec284c4e2bac61d40a151e03f30e9b9fef76fc0422394f438f0cf0d147905651c5f9fe341c467f657638ec223e7004793c546c0bd7ee65d7e82d43d5d0291f65b541b5563955ad4348c3978956a79173f54c67c7f418e865802da4a4d69151ff6a73ce6b4d36ffb0fb4523a046b8201ac1e14313e91c8e91843de968364c9c7bc2ef7e77559c48e312b340d8614326a58ba2ca103d79c2ad48f18eafdfc455633c196cc4df9278aece0913b58aee8a7d7f05777f4aba5e4d24cbe196f6aef6fbb00e98f781361eea276a745e067d63715ad18b6ec42f6f7114581e8316152a02cf2a4f9502208d97a00a307dbc6561b218aaafe183e908599b1addd213a4299bff6123f8044899105dd0a1339a51b3ff1061a115dd044a274734f28e1414c87d50369a9fda5683c09cefc8658ee894aad0d01fab79e937111d123e4090c8a53f2c42d714861065486e7cb4b592a64336a91f21827805b2fecfed34e8e22bcc41bdaaffccc708972bc7316f913ec5f39aa86ba73e76fe85fd37e2074a84e6d415e7ccfbbc48dfdc1189a34bc55505cc1701c7791619a2dacf4d7ab017c30def3d9beeaaa1d3a6fc2989fdcb47e599ea7141a60bb325a390d5f052f69a5e7d4edd02b5d0ad5d7a4b99b67d4ccd736e71c7c1f08493cb474a11a39c890fbefcee56861a0b1e1793d4acfaf78c48691cbd6c95eecc1ab083e2c5230781217d927598b15b5d4792123509036de5d4fa486f03733c082911491c29ad3308488db8e4a5f02189f7beb382cb71f571e5ec8ae3bd228014f167eca48a25cf63619b0fa2491adb09e7818c7b7fba5229c25e3deae9d30d605c68560b6757f500be63487713c9bf5dfe876f9114f14d60fcad39bcb5f0505402334adac9693dd9558d6de9de0641c371fd4d376faa557a5a6183b8fa56451e54fdd66172deee7155293324f2a856a74d5f0b7a0170574e732ba75cd1be900f3425e1cb01e4f0fd4dc2154bbb11f29c82a11c613af0b70fe0ff41b8fdcfffc6d3a634738787bf14375ac5e6cdcfbdcb681665178003b5950a0e50c056fe56f6454d5f9910a0eb60bc65eee0057de62aa265c633d73c2a42a3e4ff879164239b8c3414d0ff07ef03d14b9f6fb5c9e331974484401435c008f1dd2a4f8fdcd6b274f2820c56faf4bcb4ca3ceb341bbb9d3970ef2f0f70b7ca29d03103cfc7c8c68cf8ea77a60c7dd8c71ac06e9d015ab98aa398714b4b3e4bd87f8d11cb6c0d1c4a223501ccef931da02c15466588c3664b90781d5cf67545ae0f008dd149297d06d812482b1f7fa201e9de63cd24411927f270b95adb3fdd116d2cd5de7549c305b01340139d72fa9fa3df362e6a16551ec17aa35e6e8bf04f50bcdc312d7b548ad892d9ac49a9c50163ca1f8eca793785c096ed1d0214f315d343818a7ecb9c150d572f2b15aaf3084ac4177ab51bde195c4da0baa085a058aca753a6526ed06bcbf54a0e613ef2cca72a78e09ac8d81165ced124749d62e0077a7e44fede72a855667fc62ccc9b419cf9c3bebd108d8f54821cb8577d6a0e1000388e8263346a7d045bf7503835743d3c5c93fdc11228244e7543b9a27eb954025e1acf0d143bf6e457e81cb5dc70b0d07d0c79f6afb94ca3ea5e59fcbe267cb9151d553f95f929e26818bbd04b3a6cff686a64a304c43abe9a2b77e5c95372e22cc276d24d65fa1d7daef8cbdf16ecd73b3c464d7d6809a2d07199ead62a92524ef94832d2190d16ac6246f1f781f2ef4431333c61c729dde5b78294d2160f5d3888265d026348e0dc0b7813f1bb2e8c0f913af7a487b3ec31ab5474a20024594199df89d90eba88acf90af8fe01a4b6536fbac2bbde0090a2d48ec65f21f8c48f603dc64e34bd12ff26601e744efc82f93774392e5cac056cd99c52d2d70e39633b186d6852905ad4a9614a3546e91dd8590791ff16c0957d5585d6e2c5ac3e9f9a60ccd7b38ea427f56904b46ab97fb332af08a4550b30121bbb6c7272cbccd7db03d6fc070caca75455239934aefad8e4f42757f966c4d3dd3a28ccd77b3690f00845b87cfe12bcf76e1fdf21a45ce0cc33b754c9b8850361df8b5ef4b55e74675936c811d7fb5818deb0d7bb99418168c5dc0f79ef4da293b937f3f9122248fc455291b15f8a65a88cd0364a31572b62569093075ffb2a0e40f4ae3e35e6fe7c985cbe605942c11824c036385e43c8a07f6665157b9a4457a82ad81d4c006cf7157d12a4148136e18acc764630dc6958a7b99db38bf075b76e02bb2e7aace101c1f314321482fe232612cdce67ded70778c940a47ed5bb1be5778847fca6f133e2cca67ec0629208583469c6ed2d892ca74210461554e11cbc907c640e5faa6d0b09380282ba8fa166ace101da36035df878d180225a9c0ba723610e5ea468fe409adafb24fe5bb06d9897bd647e09f854b696e88b8cdc06539df127b2561c20807fee8182dda78db2b4a54ac6c5fa4cbee3a6e12a28e3f1804bbff8794864e7cd1ada19cc31867af898304128b24cfc7dd39a0d861c2b3b669313559185c209b308f91ccd53b9a70e972ed5a63102fb57590145e17b6b1680e10c9c60a15cf6f5d1877df9562c2420b07ba89efef0aacfefde7685e95003d60cfcedfb27c5c5951f239edf136d81dabfe742c6566101210632dd3101d76f93f0f855215ac5087a6437a4acecbdf7470339f101b331bf52766c4d8aefd741bc1bb583166b82a8103023db1b552b2d49c3677632f6c35126b8040957bb1c57ece92e3d2c8066a225eeafd792ab3f944cc5f65133e17d2fe701dd490e3e2ecb5046564b0027889e0d93d52b005803f6fe26ffef3443b3437742ea6fc1ef0751522735367b87cd8fe057863cee7658b3a1810a8362bf537b99ef91785a406d384883905be2b6483c7c61678f61fbbfeee3e66c1d520a6a1293bcf42faed2004626fe4204820d9baf658e7b989f14dd4a4dc59c9038998dd91d4f47c67dc719512df5c1a26779c173e6b1556084fbb2f579dc6aaab71d79bf2663f5256b1034cb1726f8df53241703de873c3570ec4aca31633ed299e5a168e1b50f67bd01371c3ace8ed7dae053fee7605c1c592d2f495c3ed50e734933ce81d99d16eb4479a20a91a5c964ee38940e26c9ef866635d0842157e123e2e93b1009d3bcf5a8bebd498cd951a84f2d2e67761c9d5d8f04dea899ec70ee35a8682d316432817874fc0cfa7147e747527fad00ca166f28f059024a2c7d7aa811897418a6f2a17603643e649abe47bb74b8407abc61b6f778b3b0133f41187d73ab6e2509e3df04cd28dea6b52a82b759c900234083153f73396bda890bac373d344182daf9e612bb282a677e90bd6d5be9f460601feba5c8dedae23ba7a0402086ed4d426d370d046e8687fe5f7b666979f864dde3d8f9066b163c292c369c918db80c29dd09de36bfcad8b9b955fe7574e8c39c24288449ec0cb81bb6e96d4d247122d2f91b5bb7345c7b3c60c7f36b946e75f697b0acdd8254f7fb7d1e8a221c4480093e0e73c7cc1f8987b581e98cc5169c8942c2545e6047303ddf9a6533d1062079703488d2c28d6c3d1cd3bb295a95b22219b0ecafbe3010c0fce981bc6c2538db6f85fb4f06ef854f3f8990ce77a8d55e0bdfd0b7fd40bd6c392aaf800845cfd0b2f36610ba7b126e5bbd517f6b20595303533364063cfe870d82ba2500cdc6e2db66d592b85e5f0bc7995a25588c7da8424445155f679a11d2b1fcea8133bfbe680a43ae328b4d1be98433217abdac150ca0af38f1157933936a471ae18afbccd1b914751479bf15271c35955a52314b4c6f0f37fd9b2ec871031756d068d04a6ba4c6fd4ce9c2b868056a0964e3b506ca149077f38861c47c5d70feaf2bb61f2811765c89e7fae43970abef73c3908eca4fbfa124ed4c8c94f3da569732bd9eb241d89bfad96c08da223cee04b8cc18c223bfb63c3429e253ebf9f6f293163eb80e83c8f370e2f4cab1d57395f9106678c114eb7b335ffb333867ac2627619d5375cbad5533ac709baff686adcb6f6f21d7a3615848e95e855f6074451f553d151f278515f6bdc250da7858ecf2746b05788e3bd693bec2ea0b2cc55b4535c6691df81407187ae804a5a6419ebf8a875ebab23c1e48298fad40a4ef5914268a6d80ffe2b7692d42e28a3e72612a56400ddbb62ef285823517629164ff06df57c304cf7f1989e1802066b01d8d0c605cf59bc3feac38ae0825778be5c976dec232c2e230308ffe9a70137c092ebafcdd372cf349cb84af36843620e3c4ec23b043c66dc30d675c699cb7f7e81dc45eaf1edcad6ef4b018dd12fcf20a92394085bedab8cafabe0a5d96d1243738e8a08b8e0f02794d5133167620a9e166571014f64dabc6ceb0a4ce86b8ef640cad9eb5187ac920105d607f0938d33f653f53db0e968d871238a237d47069b9a7fce59bb2314b0f84ea38d8cbc58a0a97daddfb83230a942e35c655d69c276202148572fd008c6aba7fd6afed1aa9e5273eb8447e99090c204659b8b6d8611e28d76969653ff9cb5bdf700763b527795a3e5cb3d97b0b51ff25c4a8f53e960797f64469b9940d915182c5478596bbbf4e824de24b58c84b7342a7a0d3e6114044c486311a77ceb8da36a5a2ebfba99bac52ee59d7327727c542de3d9d404fa565e0068fd2167b0555dd3321f676050d97f8b090ad7e4d51ba64173d3ffbbd35737cc0e3de112aa131079f349a4ad5e90589694b04cdab131b688aede02453cf53e6ec6bf36ae5abb735bb66c7720f93c5d4c09886146b37f5f53648728bc0f90853c62f686d46a59248fa53d05f4a07bb8cf36e488be2e93ae62700fa363998cfedba3d15dee90b6b1d3fd6b4d654493ad987624224e0c4f8431aa5e98773b31c43beeaf2bc054f1bc37ff1b6ff6ad0ad7babe0932331858f8d4c8d3fdd471e3b79b1e0e8ff291b6bdad3d644742d91bb7eccdfbb2158d4ed97c24e92c0b6e785566d89b90e5be26ba3a2bae27399c1926293b263d57cebb6c5aea050cdcb41f81c663ddc036ab6360b25d299dc1ac5beebc953cfe2f64b07fda20750b960bcced9980b41a28054f1a8817bd227c5e95bb79e099ae243913a153798b333f4ad11cee75f4bab11fd32b399c1ebdc371ee549b6182646539095ae3950d2a0c89fcc8ff49b390a2126ca0c579aaca2bb293aaca49bc9bade4b180d66abf0a17f02a0bc79807c0a999e8840a8e89ef9382bb03fa02ffb9d97c4276d1ad34f467fc50bc7dba045de92e7bdb9c936544a2c54d6b9fdaa99394effe7a7da487cfc541b70e16b9f1fc5a626b5ba21d09548304000d62f829d4b607c8d0eacb65686ed87cb27553b68006e22dbe18bd2136c405f886d7790b5bef8782b0f45b8bce5709030889b1e0df484e301fe1a1a9f93fc533b21640884a6dac8e98d61b0ab3e9fc14941f2c1d33c3493e9319abc980e88275d736255907f18ac1751bf719d032e2f47987cd11c865ad4ea6d4856720f00f4a96fd4e1060330000000000000001cdeb26019d6c99c6b4cdc69db450c69eef1f1f382db24a75ea63690a3056f74f6e5cdcb8053bfba43aca32506b96e68da77d5aca869c7a9837253c3bace99c469e58af57a58290f0740717d16dd80dfb9f2104885c879db681215049b19fd4997445ea72da62a3fe9d501ee4678a604776a94c99d72130f88b3c5a0b6575218e4e966a81d00816c5027a09041aabe8bc2ccce65bc7780435b7dce3198618cbebc3a054dd32bf4c220aa6192c4250fb9f029fdf4d92659324ac0df6970107e02d871f554b5bacdfae364f5fe97057cee089c5a04d68be1055d1dcba5c9fcadea550017af3577c990d5aace75254f63ac7d67ec9088188593151e112fc42447161d556c3686fb6ab7027bc1241efffdff9d2b452abb1c1c4b75990bcd7a04242721ac5b743b3c20378fe00d907ccd846b1e10a5a65180317aeb4c0b1131f6672a5e79a70184388d8fe158b06641451a0d024cc85e7a0a3ce3bb82cd4f5a663aea838a56613becc588d6e0fc86d55dadb599071d0bcf2aeb426c4d3935cef4668de2e30dce44b04dc1bb07b53ae6b3db9d11ee6288c1ba328febf73c6a61d65d31f30d43b0b59c9d7875af396e306c39cc2547cf1e8d75a26b4b10556012115542869513029bfda1dab16a34850ebe4b79ad79f7efaf2c3433021aff763ce8197f50d3f729408b05c65daf1eb9566007a98e5dabc49dfc4423ba6fca9299f2d83bdc27e7e2c56bc015d2949ce204699fb5deaa68f07ae8532b090d0bbac967cde47c6168d601751ca6adf406dbb8b99cb89478b0c542b7742c7647d83f5d7d8f6873479477ff6f404dda723173876556c6c0a1e5ed16fb5b0e8df47831debe07208dc8cccbd77e8acc1f6bd4de089980cba7f29579500a16d642111c23534aa9f5e20514bc7082aff7f7e8c9854a80e55923b10ccf4f8b310f77d1f2679a7a0ab449b86be272a0e36dff6051f986ab6ede7e7193f218457e94972ba5c73ed7d39b7e3b8720b890c278bbb8387fd81a9fc83da92236173fc8264e2a004688251c7232e2586d134a9b124610633c09dfb09c1d5be3a539dd9d4bb17dd6010e054bde38d50de812bf75f3b2136dc4ead4e4b079e0f039648982a730b23bdded9b114dbcd08ec98b58e994fc00b96d8c6d95cec36261e745736b84918fc0f9f622d3f9a84f2009ed64d03bcab3723d985406666a40d8afd080da99e429f25f3a0e42425967eb5c835b1d3fbf064849c6cb126445a2ac07ac3f8c6390d781d582f44dc92cb30f1368c1bd260eb476f29e6a6a3dc0870b3850033669723fa0e9f3243a37eda2970872c9e4be54623b117387da01c398397b4af9ddcf9e02389c9223c4d6db01af076b90f4b9b8b8f2e054dd1a175c76939f89554950ac337a1b52690e4d319cd66451072d7f8986d2a2787ccdfb9f84502ee7e4394871d53b3f741050d48482b242fa5fb32c53ce3346268b5bf25674a04731b323d412ed95ee3a1fde943df12b6b1f9063e29b5117f8741f74d457220ec647a42273cdde0e085eb548b5b2a738cd92dff28874a874a6e638af9c36f2f43cc2045397023c3f682b30bddcdf1ba016b4a8caa74f00595577f829cef6ee0f1f12ff6c3d655287bf1743eddf337a927f0708a4ccdfe8ee6d7ed6523080aeb20827ca58fb44a5135e11898d565f2c8d432e96aed1567acf76893774081876df221e0667ca65dee5da0090c1da716bb0bca8c5eb57c2d090cefe747b395fc6ac6192831bb31605ccefc685f02430cf3bc56de7ce44e99b24e83372c48c359dd02a9f2679e630dcc95cd2d6d381618bdcc54c806e4515cbf0c0294d42b78a288469c8bf36339a1024a69a72b9273b51e197929614c18b03ceae77b71f649d15f60c1fed4260802fae2415ee4a22516354847b9f7a102a7f2638bfc3f5654c3ef6adc445cdba0bbb7d66e4d4ba06031e85a76e4d95049f51c3e862f3261b2e1f69aed40d1c87a1f1f9d704029eaa4d8f10de5a371319552de7d1304bddcaba75777ee1d1922e3e705a4dbece444908a21944b26a12496ab4a4f05819f4fb12dd57424d5694154c851b7506d5292b07ed69ec6e193e805fbe3954985ad0da06d884b608e3da43dae9908e3311a65affa8115b231537052f5c34051c4a342cdd1afa5995049abf276e8aab37df2f4db158e48fd249610c1cbe03ad5c99fec71ed560a32c753f196d28a675da1ff6742437175d6a6a04541fa18380a204a521f6eb645a18ad3b651945170ca5482b94fde5adaefd5f4df7f9fc85a72d4e6cd7b566bc6bb8cf9a1a033d14664fd4b389edfb6a35c14af721b83255ce81dedd6c12995821c94f679a15f7f2647264d606b53c89f1a8e6c24c11c7f6463f2c2e4cfab279cec83f472b5d681974d4752d7549532b2f58619583eda293f2ce68294e7e5d81c1023dc4a050f83eeae4bce2dab5ac014978ad71ca7f0be898b6543810569ac4e1b9119ce69b750cf82e317550b6041943487ed18c6e3f1d875a9658dfd823e45fa41e0785675f9493eb2c84fede7b17310ba73a9df2c64d3f6c20242d790bd26a947a0cc3f2c30";
  static const char* const kTxData3 = "ef014ad3ba18779542bd9cbf3e4d4d94294a7d25a36a4e5c1ac3dca552be0dc8ac3422a28bc1d8bd3ca5d27bd56f178fe31e3d8b904c5ab0bf03e6ad1798d2c20de738a1a0de39ac304a67afba7625c9e081bcfc63922821164f77837c3ea62a72f0529b6d77b832ac1671c7a0f1b79067fbde9639efd77e9b41c3ef993b3c40ebb9bb004773a3df2b7d1d555769e18cbb8daf425c140d346ea70ec346e237d2bcf36e3232258798bec3578e618cd399410cbce8d76d7c15b6178a2171db4d597615ac17e95d153a0d48a3ca140c1cd3f3c083753816cb1600a039dca0ab3220cdfebd96d4e5048a1e7a556dc9cc12f6adcd2cbb04d5cc2a7adc4ff7a2846cfc7a205a7a1d4e52c34b69af0f60e6ef6eefd2aafbe36762a958f950c474748dc01d4a0907f0d66bde8a08f4344f7eea6504e485113b2014b25035fec03a40065d7564d3412db75a5e0e6b3aa4af97938052c80c359c095539cff44f5c050aaced1e2e9cc68687fbaf43bc3a90d8ba95b884e32b76308c8a31e4c37cba2b8004b3faeab76134c9bec56907906ccebfeadea73806bb38f7c1cceee776a9f4dab9589333452f56ac9fb6761c4560e9b8c2f0d3246e87c34b647e420c7f10cd59867e6b2f75ab5334da832e5594a003af5bde65f2868e7da43d8004ee3ef947cfdcc51f2dfcae6bd6fb7d568a02f95253c9b72d1331989a4b40d21e8639860e807ca3964eba1d4e573f6338e0c503bb44cdbdd3b9720178c5d697fa62bdf550f3c2874e012d2374daedc048f534f5d865f501dde4bc04db1a3edc820373466f9e806df82ec093bb1184ce4e1371d3a1b7e631ecd7a1479c630fc6cd4c8a0e0c140dbca7de123edd9bdbbd20e145fe6f408fab0e47e7fcbea9d3a9f2e31baec93f0df63a1dd040635812c29cc05e3feca57153d6cd5f64e0e45f43b0d9d93235d5e550d3abfea00562fbf26a34a1ed72321e4b2979346dcd3980a062d013c770d938a5bbdbcf1c0e796d48c8952fd0158d745dc148b0f90c178086498a730c07213cde52f93d71a268fb855989f4e9bc255fbcc053a35bac8abfe46207e5ca345bcf71d9cb3fef2c694cf4776f1cf91c57174adf54fd096473ac93e0db88098e29cf8acc075b8b316ac6b3604a1240028999605e3838442747199d0642789e6a3a81ba8496659e7af9c0dca01f1191492452e91e0a8ef8e30dbd1dd53d9ce2d5efb96655aa0a5941e26f8ea9a16a8c36193e03f3e9d8409c14a54fd6b3a7d321d577de8d93f541a408256542eb9fdce06cf2f799b50e97d84815bb24280624d97b9d44f3030bf7107b62e407cd112c64384fa2c7951f92fd386b897124eae75386da0443cc1c7ad1b160d68cd0cbaa442168f028b51f6e14ca737d7268b827256c6b209061be8dfea86dc341546be7c30ee4bbd7a3198eb3a57f41a4f3586b0c533ed4ad60fa17553cbe3d47042b31d88d5ddbda7c590925b8dd6a56369b6e29431e40bc93fc5181b4aa6f75d576660c1c7785fe78337caf2abb20c68419a383b28293f74467b4934b0ae24f29f5a11753340bf3235e053735f839765a13acc23a9acf2bc48a53831225df46ae5232c3303b6a918ac4eaaea4e5996061ff0084be301ad573368ea7ac8714a205870c6e15f3b278d5bffdf018e84e4dc13a1cc1d55f2daeebeb83b78747bfd783053f59fc6519c4b97ded3ae329e09aef8e98ee52517c466341436d1213d7cd1c8781fec4f0654d82ed1995723e710b85ec3e3926314c49c8821767f16efbd360a99406f00f2c68f59334ab86ed6d9e6bfce590cba6c9db61d43672588b1922cc727733f08235b2b6a92bfbe29a30cea879a1e4b87d22021b4b6f3885618f3a6df3a19862eebce562b3360c11ef64a4df431a7321393fd7ddcc2a165494ff89698cf09e061a41298e26c958da5dc1b914e121e5a747a9fef695aae076a7ac02c03d367b8a49962562bd5c7c1a55b524064d9c922532f8e9d5e2ad3b9b62bf0b60f00bc269a5b9be176fe77bed5eb984b11220d9d393f3a61fbb1d0020e0a644f65902bbcd795aa44b179da90259f7e53cbf061d5a319c05ef75e2cfcd677f33ce5b3fb3221e48a68027eeebeefef3914e21d195003705c8e97d3b05d8476271a5f2bb59f09f150d015e3bf66a7101e61c723e8ad0c5920a7690ea816a80f7d233777d199beb948077bf34bf7ba3291dc5567547d2283d4ac6814d0a9f4e733a1057b99fa4302814e3fc65d3830cb118262ffb681395534f2527afa360eb35e9143841b44a7883b7b5b915c0bbddbbf72a3f60493bce44d924bc09f1677591bd196f9fae6b5b92ba40b77f863c8394179a9c6a80688415242932ec0ae14394e8aa7fa10b42f743121c18950ace39fab286da1c831659b1d3a31bbd10bad9ebaedac7361ea029f870aafe985446a197870fcc7a4de082357b517950092b82c8fe9ff2f23e0bb2dd0f5a700e9f106560482f2bb969fa225990ea71ff80cf888797a03d2175819892dcb5cc09d4bac7aa6e567ecfc762c00ec597ca6b1d044249e28fb5c44f57d5b761530f42eba2299835c68817ed737a27c97620f016367212aec3bde9dd019bc928b10bf83896aac34705242bd124ca705590b6152884a4e3c3466e1fa08218e71015de75b232534afa224febadfd8f89aacab92f795ced50f5fe41cb85983e4d53bbc7f2a76ab034f08ad5734d8d6fef0710ebe7518419c88ca206c00b443c1698acfac34a0cb9393f3c29512b57ec2e5b67d97f77b18c586539b64c1db024b83007aa3eb9a77bb51ae555991a73693ffcb88e54c02e1cedffb8b6a12ad1e05d55e4acc9412e665234ff8627c3f70465c636f8865d5da2d901e6df8ac468acc7096c0a60f16cfa67beaf492b9e0f8b06fdb73e3f5eb9b5ce4acb7db5d77c3beeb6798508f9d13c53b5fc52fb7e5e4a2a4e1482d1a44758f7aaa14490f32ac638347da488c1849f14cb33ac501e5ed3f1d04dc1b1b434ebad038cf7c760af6dd84f3163e3021a03f75d01a53fc7841e08d0e684b97cb9a48afceed00615dbcfda510a8e6c018c299d1bea3d93fd48993dfc675f76dadc2411fc25cbde9e1fabaa16c1c9a4f4992a5bcf493d52e25dba12499d6a7df9ddf5d4144f7c6be0bee77db31d097c0694fdb66c5e95075d4e12eb98a782c0ab70ce7ec3a6cd13ff00cc8177214f4cd42fd9ae9205f9eb66d9ad8d2263ff08eee11a65bfdd38c1b576d80326eca334d095d549510f9bc0d175516e923e28c2e3b262d1ba9910ab4a551a68e3a84936db4b9dd1a24381b918a41d5d4d07edc7de9dfcf02dea00008304000e0b019e6dfbddba3d4e8fbed4409cfee8fa2171e311120976c2ec7feb5ba0f2460725c9680fc816ba2818741e7060f36e89dc980275bf8bc6736eba787e01b6832849ee1fac8a90194209a45425221c3e6fd644a993d700c84e528225c67500441e08c62dc4a9b5301320554b4f60e0f32eab18b5817b46900f8142a5da31509cfd4e106033000000000000000158f069007f4d5faba1ae67f53c3fcb327ad081bd003bbdc9deeba205d4e0de1a956ec3cbeac0f379a2713862cfc6634c9a773bd6a17d5c5c7f810e620f335abff037bbc58aa1d2c198fdd4edebbc798d59938e474885d2ef5e876629ae0225306727867e727ad9b985f9dff3790a243ea87452835743729c19734e98f06189ecaf86adca2341f66b4f59020084c9d4820ccfd61347578e3de7687f6d6d1e1685cf493937632cdced0a4910c6d996f2d07c7c098ffc3c3cb436b4ce53e318b300e2bc5babe2fed8e68e8aeb46f5affb9ef0786a024bc1d6de7d31b5975d87b4967bf5fd8c00bbd0ab2ac35403751b981f79237edee5e68c463aae51bd7a599b64be9dfe08a1572dc90bf577bd6bf7e653000da80234ee1ea68e86f2c5495277e442bb92a2f6b3257ba45912cefdebf79a798ed984719c2359e36f2c56c3d2a3b762ea540e1f756e3bfa17451376e2278114dd15acb99a32da07d1633b07b0201abba39bbf478e1dca89a29ff9043002ebcd54fce8f1991aed1ff05b212830461c9263d792131579eab721d99b5966f6dd82435256e474f7eb4605df7ff4a5cc35ee3cc7943c44031553a182bee813375d6bb701da1cdf00213cb0cc6981aea4430c1a63ae3c7e6bc5f25babf16c60fb3e81a6d1f701476b2b36cf5a558081f21dfce5ed94829981ddc4ba4d704aca44ea77420314a605c623866dd0df0897cd98e4a0a9e5ea88334d0b64bf72c9fc98b860193bad80101ef8561a4e6932f1bc1a96ea6685d22ba4ab548d6c8ede75fbebb9c80d76528e9aac4b4fd3464d03fe1871094f94287ecc44d8c8c7e02021875cd107d1f555753428a1bbfc9a0c109c1e289f93d2faf05e4cd11926577db5889a035da403a6103e014f2b50f1a42de8ade338c4455ae85c85a6c88d6e026cd5322637fda1a82cb0885979ade6994311d9d69e6e6e1a2b613496738952796a39f17ac666b69bfa8c322328bb3a73cab7a41af05543bc952e2efe0c12a09221c3b065eaba04aa91a56dea6d3fd22082cc6a64e4f9a8a2bb6d82e7a5ec282d55e653a0807a2fdbc30ccc0df011350fe198094109a65bcf796e5dbbc3ed599d52c7dc87a7f5c87963edac3d7ed32c6380b99c32bb808f61f22438770642d010ce239e65afbbe7b31b17283f6dfef344b0ee4259dc1d81d2c50be546f3ef709ee1637e6bf7cc87c0fc652f6c3c5602e38096929c950aad40f1087abb69e66256ec7f1b829bb592440a2b20723227055621af5306e1c1d2aa0afc5a0ced638507b0bac167cb6c15476bec753ea1ac661eab714296fbcbec8e7e74d80e73251915572097475e83c765b856e15a030733841cfaf206f6556c7f873828aee1c2eb9e7860571720d943e5a452492fcfc0e139319a992b8d7d958de57a98aadaaebe6c6353dabad0905db76f77eb9c6b164a04f50aa60d59927841014aee3bf1fa5fda74657f71e5637260d67a4cc8e30f02baf6ede5b410060f8c7fb8d57ae017bc0a2cb342aea58edff45a0d0992f1f8869c7956a042543d6a5a51fa98aae218cd7761ecb510876b9669366ad38c530a619efc1134a3caa3169bbdc86adc4993e88ea57ab6c7f0b5137890188603f87bf46933f5960f671a7bf85bdad68a78fee2c685fb5836b72b09fc6dee8d3c6d41694c662aee2112d3d3d5db2f2639c9b66a7354604e77c75a29af9adf448d85f0bc10dc8bf72ee93c3ff635028bbd39cdc568897627af32ee28b26112c80e4db402237ec17b7b465a644c77107bd178ba746c25431a896acfeb7ede92cbe70cd79f183e1ddaf445e18a72a95122f4b4a18535943a7cd3465f2a0b93c497ea7bd35e02159a28174de23db39b916d28221fcc2eb7ade997003e55d1b1c42a64c06220b4199d0b7353760dca263480d1d0e01f6b492e86bd9b76669b51a10c42cf75d2b33d818f970f1915f595f4918e0d93ff901bb8cb4fe5c6d633137ebd50b58d732d7b400be6c307a03bb1d46247c7a99b7392d77ecf45b35f0eb91b697eb29525e2f4b13eefd3df619a47c090ae1ae74ddf4fad7c4c9c714ae3582530d131e24c171071575a9fd2a758fe75b33b226f9e5ccd18abda81ec5b7cba5db084db9f1be0fea1d63c582c1afa3398264f6a73ffe83f7c8bbcbcb40bb0d1d8a6506aa292627eb4f48c81c3ce66c5deaf74d1a5745ded58558dfdb8c6f754eb9c3dcb655c69be317343a4927e9825d821ba889f4d73e4a55bcfd91525c50dd7ba7a4d5a1844ef539f6ffca4df4df7f2bef51ea84bdcc91ea50c79bc2947398b2ead2956019f7420321c44a0271735cdfa0cd7b67d6ffb4d0c597ec131fba84ef6c919ee2d090cc70e83be96064a15c336229ba3f41054111c7d7d5edccbfd88f682d3674e1a533a970915769a04a8db41251e2a5d78afbdc1aa187917656d9264b846cf461e419333c089dad435acf5fe362312d546b40acd6775fc4af1cbad61b914708112dce3b34a6acde43f87db2360d5f48cf7011a0fbbfc3d88fb8e7c318311527cef5fafeab7790875cf2fe34ddc52a0ee3f73f145bef0bcf9f02c193fbdba8329c76e54cfbc597ec3a37ca514ef428d0f991f3cc5d9318c6d3fd5d3e46764394cbe534a8008a8e16972e5a6ab8dda3b323c0b7865f509aa5199909acaf30b8b9d42e5176b27c55dff64a7086c89ca465c1bab669b34294ce98a92b04ab2dbd9f937cbf6f8685ff2ce95379cc91d93345205abb46baba9e1d9143fd2be42bee90f926f753dacee514ae120041f0e76bfac88bb4ac5542d9c38cbd7b19e4c59724e0708b01ba96f0c6d9ab6e6f07277dee4ee5c645136e3f85cefa16facfdc093aba8b091e8ae1790b821416785e6a51e345674e2e5da5eebc411f915d5074f9f51112fb2cd879d2b4d0cc4231fc8a55636f9e341fca69e62e9dd5de5e692cc5250ab3e99d5ff5f120f8b834ac63db5ca448c00e6a4df6889457d9afa4217ece4194bb87795029114dc817fdcbbb815c2f15ebf6d838c79fee05ae8c7b67fe7dc86bb66a541827179a2fb38ca5a8c4fb7a79772880339d557ad7a731419087d7a0acdb51867ba18affb42d844a1d9f727d765364b5d7b1b4de51190a87e2b21be1f879861942d69ed79429866882c06cb3c8ebf19194c4d656dd2aaf3839d7296b0e8e9cf714abf97767b941fe4506271ecc5ec7fdaeb732949a5b46a0eaff516530bcfa8acab54ceb63e2e55a6a04bd4a0864fe3812f53185234b24afc430b504a278e0cc98540e3ac0585ddde285cb6d790f1f58462babf6d12ddf1fb7f51e03fafd5d63af924c69cb13fc8ce7252d43f3e471c4aa79aea899c89e5733f06e289825b78406112f9e2e652f60d05879595da1a966a885748a5695b1b96c46783e03222178baea78bd829de597c437afa1e3a40997ef0dfa19b466cd59ca8d518160fcdf072ba06878d8a6cc06429fb82238e4fc2a6934fcc8fc071e3e403b3666d33d4ad36f0e8e930e5ee42f31c2302d4988720becba0cadb856590eb631719fc1c979f822a852a680c32bff1b102d3c4309752c819a1462e365c21dc2e0e07e4b617f4b7dab37582b6b42dea99908783746a72364492e138e461916b4cb41eb543ab942ccdf2773d38830fab34a54eb71415f382ed879d713ec264da36470c1da9538682317416294c0e8e7745d3cfce9db3b6356d2f31e05d51a61a48f4a1cea79d0cd48b40518ee360d7f136856d86b3ec3efd70f33e9add72d8816ec5f7cfbae05a3251d500df0bd812b3aeffe8eb29945d90f4b9857622a0f4326bb0ab73f437e15dadf3e73a1e1914ae3f30f31a8f132b4907add4fe8f89e9903ebbb751894fb5ed15bcfff884412a0e3cab8152d1637d76bcc74a81923337e5bb613b66f8fab300b3865e1348f3b1c8b8b7726e862582a881377a0c84bbc8b4604c337593da7b437bad7ed00da3dcce794e5316f70b48d349909b54c3dca6fe761492e3d418546ee9f2ffab55e456d0406ecaf9c4ae1141e91f3b9045583d7a8cda4af8edbecc0a2d16b72e237d920295c95755e42e08639f134341f102d703fe18484e111b3cba61495eb51117393e5b50d4cab6769ff25bd84ce19ba4d8bf8eac491679fccf1852215f5cb52a05f638974e01a51f3c7e21a355d3e79a06369e9c182f8893eb2859800db9865e119568c1b587995e6e2f0107283979bfc6d4bef5b00951a7d0bec6b96d8b9949617fa7da1d61cb161e4ff7778c6a0227a536c9504bb72c68e0a459559a1e407360596c833d1abeb408cf42ccf0e43d58511f47e70c0ab693c1d85b929c4c656a09392f09ee44147e7794cb0e3e0ea270297b4abdd47b83e84deda7f7963d61a27a22c21375f773d578256aa8515ded380200ff30e0872fa7994231f0ac74317a7d35d356de6c58b27f4573746b3af03392fc640b1d78c52ee3009444648b443e1743aa64f3eb41609aefceededf39e3491a4cb07df06bcdcd57e57b09216b6f7461702c3a6b7bb05e54700718fcbe25fad35140d5e940ce2a3a8a6e1eece7e6d5b538e2416bd6fdf3baa65237a7a69f20cb7b2ac394610cc62cff2a4959f72adf88ebee3fa1d3744248289c6651f9abd0449eb2ddca6773b2d4fdb31bbed7009d019145848b8c0452243af83bd03684042e42f6168d9c395e892cb8c6fdfb9cfbd7651a201992c9faa284e2c2f7d0ae2dcd02b44ff6adb22476beae1ec3624eb3cc50f098f2431d920b5dac136664d81b525dec5c00d3b04d9b4402dba9a7133ab33404d11fa3d5ed32c9688ae40024a25e8a8a83b7173341aa6f293161b0e75927ecc522e25a26586f94ef6ff2df71ec36a2f0e8d4c4e4ec780b43fe97d25ef1d88fdb1bb64e10507fd17c2a9b83b58dbdcce55a3b2281290d08f6cf15de3bbfac734e7f30a484cd5df39c2f891a42c3138871ddc57f8add9aebe933bfb953c21925ed2cda8957b4f01c6da16a32c6ce4e2256decc82c3086305f81fd6bcbc289fe97ff64e6db4848b8ae45637d92d0eeb755d36e6492a1b6fd01931136bc2ffb79da9d86ebaa279ca8eb5ed96c8dc82d0adeac5a0e6a21f288b4c36fbb00fc29b965ae25328fdb8e3d720d41056d0e22b43b72ac1c0a2505e695fc1ca953f0287b807699c7716b924be639b042272b528e2c9c3c53ff4cf947d4de2f264e6dec89c5436aa934207c185dc667af0c295981153d6eef98421ff3461c6203f67ee9ddf7b0be3927d2cf12d4883c6753b7f4205e55482168841ba7069de6e9e113ea63782d15988c37ab62d28fdbc2bebcfc00aa3334529a4af0d3e3452620889d0b08b8ffe6dbd5ae46d08de442c916e9d80ad2c3562cc538929604c874dcf7244d1e9a66b5d13333e94563b5ce1fc4049f0b246d8ee509fe06cd809c04f94b55662881e8a6759a89512e21b755dd23c00c405f0e10fa057e7b74457f63c484463fa3177708123e7b0cf8633de7960c1603f1302e55ed68f2294c3d75e26e873525341c2978581fdcec182d7ee1db47c6512969efb7ec06c0c64463f1beeb1cac8e3295f8fb53fa415618f70943fb5634151157e8266351fdebcd8bf7be537b23c5cacb42bc9996e68500384d89e8bc2504b3c87924f7ed18c2283edd28141f1e49a03fb1d6b64788c30f97cb9d6c7e4ecb908267c329b701250f123c0bccfeda1b891b846ba52c42db61d04e6bde647e7d61d12922de59fab14cf69897ff516fc46a99a2848a37abc0c4baf529f26cd6fe31abe9554b5c517407112e860bf99100a80694ad1364b4f533e0a9cee2136a8be23d6d1defbf162e1ce5035e8259de0ab35bea8efddf4c26fd6494a9a34a196f0560b742a57a7ce508821495426c67b0b00927d2b6e1a3635d65418ba8e6936730dd2a7d71271f64d696e98a9183040007c929d8238807d4c5cebb7faa72fb2c22b62995bc187e7df00d70a86f078f4f040bf2fcca0667650cf4b4ce6c7f4c6dfa02b907b9dbf190f68c585cbedda8ae966fd0bda83808548e54a61eb321c06a0f9f3b1e8760f893db2032d96d3381ecede602358a4098b67eb04a7ce8fecc76044f6e53df42c82464990cc6e98f126f8cfd4e10603300000000000000010e390a00b17c0a267d7255f2f459a524823a260b840eb2b85604ab7e60eab598b060d60e15748fa09f451a5ab4a4de7194cfec12b1cad75b1e4295b5085130e339dd65540e70572e6a986b61e3c709b33a79d2a3f0369dfd323ba03d77195c57805f3006aa0811a24bc2270aa6d007f8a0e9b26396d8bf95b47bd9c37b570472e2ed4d6dbe7bd118c3ceb56d8d0a6d39fe5e2fa45f3df3b035880bb288f2d61757b9c03fea96bbe5221141b13767b9df10d2ac1cb86e7582e5774c7daa0ed7d7eab16b0f63e738dba131d192ae6ceef2c14c5ba3a1d9d4e6065ce11a1ffd0dcf38dd8542b712898b8164cb3c3b6f5ef5d577a7fbef2241524a51efce070376c1ff224836b86685ba6f7f4babcb21a2f1be383758904b412a4c86e4e46ed62177fe7c1b5aa4b977e184df73d43e0c5c932d6b0174382119f54a65fc28759459139f994b44ad632b8e446a59233cb6df5b62af571bc52f8c48514271ee2eeea1a618f23ef65fcc45f8408e6e0ccdf74e19371a3e1744bac38e680db33e4e866e3d4b01bb3e589edad9b26c38af0334f378a2d46d4f138837396a6cb5ebe75aa2df4b61cf185c79dd1b243f087d256184d1427888982b0e8f99b1e3226715cd944e46af6222f496f5139d676146a4e32d98008cc8ea94c7fc4c28f55e9c7a65a90097cfb49b45dc545dde944a387f957b97328fef5ff999f69116f6d6e76a0fbf6e602f393ed89426ffd1ee50b0d59de1e528ca7d98baf2ba1f001493eb637c9e0466b7ddfcc1d4f24f1782d6964bced48079c3ec7d9a930e2bb34f6b57a5e22ac83cada1e5f20238e8a5faea099af21d4f50713bcb8c1a6d7c6e54ae28b13f21a04262e730bf644b628535cd1c2c55cf7602f7c629b49ad4b0afb13f969d51af1f9df290433679d64ba1841e4d24b9763ac637f830990431ad298e7a20f3f9b1fe27669f14ee90144c7a6843766fe09f0848dcbd05f1fd63ebddb0f21763f1";
  static const char* const kTxData4 = "e9741b00b844b83b9406f28331206bae3f00219b405fc6411f376228b9dd3ecc5b90978b03fc8a7b69397243367c4cf2f463706f6bcf78f1dd712dfee9930cbaec07a4822369950e35a4b57aec86fe1070ab79982e7ee7bc616c8b94b92fb233c19ed8539c1d7d111af8a8cf83d4efb576943502cc6801399182ab3d84cc2a1fd910160bcd6545b5a815e07786db3541cb02c1522973c8d1c1ab123dae0c5972a026cca53e763f2802af3822e4d2df8e215339dbe9123691cf9dab52ff970a05c67d3d75b55fa0106c6d5472647d3a44ffac97a56ceb984e3ee9bef4f24cf8c24aaf1604a9175b13798913d943dba7cd27b7e0724a0659996be26a7872eab0cea36261edc4330a84553628c5e93f8301589b9381dca901d3b3d0f867a40d9641bfbd18239b99267acd7398415c05bac5c7d2897d861d6a6d6cb368cf70219cf12e6b7740cf76d572b709acfa4a7cb195596298b50691d1b89ec4b7f81c3fe0a50f080befc9aa39fdc5f585f05fa9f7d71519487095141b4e75c7af197d0c92d3978fc1a03a4c0fc6b0037245d2944924bff10fe8eaddcae04b16cce10843d57d81f05615936c75d2ef243c7dab1f0e4d52b2177828a783591f9ffe64d6720336347e4fa1ec4f42ebfb3ed83b1b2c1e1dc34454c468df513b0681ef317c33494f21d28b788deb6a6e088b3f18d9bc91421a791ba780df6c84eef08fd405845fb6e2e4c584ec589d92164e1790efcc88d0b6c84f068595d32c2784aeb4290c05e3c1c05c52af720e75cffac1a66f6d7f611c82dff03175d90becb93be7c79c6d6fecc81df3b3f1493f5d189eb77e9cdab7a032ee5de856c0511c88dd442c88f9c6623437aca0af857ae51b30e427f1a4054fd669ff6c782d6917278746be174fcaf0df25d0241cb6114a17d467d5a98270159e5ec2142dda77f4ab2a8f2ff2710c5782f4b7c5a7c2ca1271833780f61d48dfc5b462a3db8bd6731dcbfd92d8c42766c0f0600772afb6cffcc619337714699678d912e91590aa7d6548264818bb88adbe80b09532eefc989d6d764ccb471e5d96a199529a5e202a8c4671ed6b058698dad55cb5a79dd275bd0e3b68b6f856639fd0c9c59083b52345a3b78d45862aa0b82c277beacce82620331814576ecbd229a4badadab89c4bad1c21f9ab42ecd7dd9433c7f9834a6aa1ede2a118cb532e42b1c2749c5396085ee3c0b337224e2a4c8d24ea68788d8c840d53098dfd2e39d887198672c3ab86418b9712c3f02278cf275366574d144e82d26b27251160d1d2c0842af292c706a3e983bcdd14a7134e600adbfd19badf8efd103ddad447a090c092e9ad8c532319b84731d02cb6beaafb835ada154b1c22e3970452951d8070f9c4a850f01018a5e778b0f3e8d5a47125722c56432c468f827d10aebabfcae24df15fb675940c0e87a7e522109a907adad6ddd0f9b90cf8102d8a315c02b7a44da3857c188421052a3e3cb3c1c6e2d9bf142ebc9acf3e69138b43ff28e2e87b9e391773597e28eacfe400d631feb2b42fd15b09fb8982386a829f73beaae1d1b1acd570819a965141641e0c2e44572a23dd23539af1e0bf91f2849585ffc468355ee4c43f02891ee395bf6b3268a69c6dc7bb8d672bbe1d5cc4eba904f126c00cffe626b18a433fb44df024a470e59bd3a2ff3586b5b2cf8d9caaf5ec56ad53991e554558664dd516fab9f2db26c0747460a7fa6779dc4c24f6d2c39a835164db90f3c8b787b7c67431d280935fb75af9308c71ba9ee7339192493b9e7315e021cb76099fc1ab4bdee804e2434dee60c4895d360623468bcd3cde7a7043aca999529c4f0acfedc3a43e4bd2a8becee1517ffb496b133f2364b485f2c963a235a440a5f9f8e7097342865c5b4c16a76d01cb17b85b6b02b7f465797364619d8137442471a2fc9ce65d9efb9edc7401b85a7cdf20b2131cc4f3ecfa4849e074506fa2b9e54cf08631ecbe1c983e06d213e71dedd3a1b3d2cc113c0f980cc19639cea3d963bd45bb7251a196cdad9172cdf0cf043430cbba509572f9b833c3d6ba714a6b4cfe9f2c7eaa0e758777a3ec47b1f568311789348701f8a9c37087a69bd21cdb1e1f1b779f2b2448d1e2f7807489b96118ce8286a2533e31cfed41fb1b0b2d10f29a5da93aeb614b2298a0012e91fc12171c62b31da88da1c160f445eae9ffa93528e2d46619963f7b0755cddd5a15b042693b1e4cbbef65fec71ec2f7baf0ce54ef08a4ad566384c26cbd4a7b30366c065cf2b5f2d35f35987641bcd7cda6b6522ff0caaf5e30ec2c5e4d5959c85e12d825727545ab6bb925a19b72b9e61d25231561d826e7f21b5379d83a9c9125c4e06d49090ff76e1ea1f21d063d3fbf5f8a21c2b496cef6388505b12cd5f1794ed09c3455e5c952081ca4f42849f5fb61ef882ff074dbb6b987caa403d5f91ebc8d945e6a3bba290a12a46842855814453f9fb982c7df66abfe2beff8adc09f4a1f14e333c2800c7fff2ff89cff563e9ece9d608d3a29cfa929d46c4392daa22fdc5e440fe5ea2d14530e1f843a645a299905b4e65f6962b1974ed03d1a344b65c7f4f04ab6e9121b29a7a0030d6dbd29b47d60069a4d4460644f6fa1c3badcc655fc14c402ea48bb8d1e8df91c066f21cca29fd01a10e2ab3e998868cde39395ac3024bbde9efab798a401612bc45e1bac899445ca50845f3691c886fdca1150c439979b6eb72d23c098e267e3d25540ba35cbae170490491651f5a7fe9402ee875db47029bf673f35f3392a675c2522eb4dba8fdf5d478b87b36b1c00c4b877d53711405e28ded05aa9fcf3fea6bfb37bb614edf088be2500ec3a97c0497b0eda1f9e5d7d01c58e1b6f68a860450f5d48b526e96cfc4a8d0794f2feb3be6610be6d33f7ecff01d0a9c1a24ee251b94522584669fa854a29775541b6e16762c738cb2953f4e58ad8424bea81f902a5095274426b84a8d9954cd05d7ac7530ef7aeb8ad2e440ef98e5a302496c0b3bab7713599b88420e09ef1d19081b676d84798a88fdad68d5c1e1d0d6fd5c902d37599c636d0b8d025aab620a849669180ccaf9b7f8c47a7f1da0995a7acd9d43308186baffb5f2943d21e426836c50dd6bd90d495257ea38ba095c17e7caf5f39e72988997be006e06cdb4177dabb071a60288960db4fefba478d2b8252b041ac0d17b5f249e59f082a7e0a9ada5b2276b6ec788e674e4ad729cf3260aad04c4e7e5ab4072dbce609a54e4e46f7e931459240f16d15704721edd050ff3470d1b6b6630bd378b1b9dc946f1b11067b3afd39b51c9b7125c5f23e59f2d32d58a9494de8218620dba07b4d731f0fe7616cf40cacd485a78c1ec89a6d44c9bb9bbf9066dcc168ef03cb5b5e2122f91fa33e9a7f9684a4abe7fe5b7c222e3638f70d3e85f12ac324546d0740e63341378a380e9a9d74eab017cc88121f90fb1262de05589f1c5ea5d5a9506f3bab9d259f8f106a2c453a9cdfe7d6bfde7a4292ed70a2322002c3a1936ec437aff863cb34bc116b0f1d32dd9db2285e9c684bb2b23f9357fed221a5ea4e1c14bbce4bd10d130ec04802cb16d361ef5d22803e1ce6d7702da1c488195c0b186071cbd08ed41dcf67b6bcd0209dc9054804aad7f2a88fba8c4d2050ba9ff289e21f903002c4970976f21328dbbbd764c8afc127419d697a5117d3394deaeb1012fd5ac97900fc383dfb36931ba4149fee6d050558468007bb27d1d16d0e39613fea0e891f0d8b7c38498d9e9105aef023d5b677f9ef160d9c5440dca9b1490833a02e4596869f36591f9b8f5a9de80d139909d077a428fc5f4587177e5c4c427efa83b683fec3aa539dcfa863624883a8c09e197ea298fa78b435a3612593879b72418c8edee226083f2e436c3274cc3c8f1cf297a29e39f527eb664855dd03fba007d1a87294874985cc2defe32a35bec199ddb85a38f5bc698140ef52a23fe6bb84a4cb3af64ed50e0c85a01c7491d5a6f62ceef60b14a002281779700e9b1c3f8a7763b3993bb8881e6532955ca11c6b11b0364f5128166a5f3d7b619b27bbbee97f33f8f6e6f9699f20fbb4503f08f5bf4364fbecd172b9b58481c6e2caa8481076d66d4c090c7390717cf36fb5f8e2d9712d0fc065330d2bc400eec67d6be77ac843b144e2ca691d79440f89d528e6b0de91a37fdbcf65b0851d6d80564ea44bbbfc30506aeccf7a2d486ad5ce0d77902da649103c6b60ae667233a8b7a6490cd51c8205a7c7ba349acdaa1fd27e082e171505b609526cbbf4b8fdf21db80b48ceaf94595cdae232f84b35acbf213f1d25ee65ed3c5059f3893bb74fb3b266d84475d764b9f44e6d68e10007b8220ffca79a03073789eb71cb5f55369e6af3373210023ee1c77b56d54bf8e7978ac14ce5b1394dee81983b86e3150f0e9a4fad6f4fd4803b3435fd2ff8f5f4718d18a603a72cd3c898f6f52a7d8ab37bd14e0a2b2f65b8a0706afa36dc7b459c9f8faed30bc190beb8209d04fa33b0f0fac58559291423ba667cbe5c6f65428a542c3da80bd36a14cd2b120d6dfb57c0a52706e7ac3faf5733b7572d2683c4c85e2bf365bf726916aa92eaccc2e4700de4d876d22de4b54d6994f3247eeca76fb931f6c9f87acf1f7cee0e6b0fd7d09623c0790dcaa60f5be304809c32ba5606f0a407835f9d3cb21153c6a217302163cfa2d95d34e89ffb5a8831c1d6b7aedd02dd67263bd2b8676115afd4d72f5cd855cacdb1f52a30612f6fd5b0186e5dc14f22d81bf140807172592157b0984e85fc3f77a3b301307c55c152b0f02772cf9aa7d4605d956b1f7d686ef262146a6b0326630e1405828cdd6eb75389e42a79de76bc29e2e8631a6620a80b06ab1d9d8aaf55f7e3e3d17a9605";

  static const char* const kExpTxData = "5523a0a083a46056bb478242cf543e8ab5d2b5afdcaa01449771221da4801de1";

  size_t size = strlen(kTxData1) + strlen(kTxData2) + strlen(kTxData3) + strlen(kTxData4) + 1;
  char* tx_data = static_cast<char*>(malloc(size));
  EXPECT_FALSE((NULL == tx_data));
  if (tx_data == nullptr) {
    return;
  }
  snprintf(tx_data, size, "%s%s%s%s", kTxData1, kTxData2, kTxData3, kTxData4);

  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  void* serialize_handle = nullptr;
  ret = CfdInitializeTxSerializeForLedger(handle, &serialize_handle);
  EXPECT_EQ(kCfdSuccess, ret);

  if (ret == kCfdSuccess) {
    char* serialize_hex = nullptr;
    ret = CfdFinalizeTxSerializeHashForLedger(
        handle, serialize_handle, kCfdNetworkLiquidv1, tx_data, false, true, true, &serialize_hex);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(kExpTxData, serialize_hex);
      CfdFreeStringBuffer(serialize_hex);
    }

    ret = CfdFreeTxSerializeForLedger(handle, serialize_handle);
    EXPECT_EQ(kCfdSuccess, ret);
    serialize_handle = nullptr;
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);

  free(tx_data);
}